

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ExprNode * __thiscall Parser::compareExpr(Parser *this)

{
  bool bVar1;
  InfixExprNode *pIVar2;
  InfixExprNode *this_00;
  ExprNode **ppEVar3;
  ExprNode *pEVar4;
  Token op;
  Token tok;
  undefined1 local_1f0 [32];
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  bool local_1b0;
  bool bStack_1af;
  bool bStack_1ae;
  bool bStack_1ad;
  bool bStack_1ac;
  bool bStack_1ab;
  char cStack_1aa;
  undefined1 uStack_1a9;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  _Alloc_hider local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  Token local_180;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  bool local_d0;
  bool bStack_cf;
  bool bStack_ce;
  bool bStack_cd;
  bool bStack_cc;
  bool bStack_cb;
  char cStack_ca;
  undefined1 uStack_c9;
  double dStack_c8;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [32];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  bool local_60;
  bool bStack_5f;
  bool bStack_5e;
  bool bStack_5d;
  bool bStack_5c;
  bool bStack_5b;
  char cStack_5a;
  undefined1 uStack_59;
  double dStack_58;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pIVar2 = (InfixExprNode *)arithExpr(this);
  Tokenizer::getToken((Token *)local_a0,this->tokenizer);
  while( true ) {
    bVar1 = Token::isComparisonOperator((Token *)local_a0);
    if (!bVar1) break;
    Tokenizer::ungetToken(this->tokenizer);
    compareOp(&local_180,this);
    this_00 = (InfixExprNode *)operator_new(0x90);
    local_1f0._0_8_ = local_1f0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1f0,local_180._name._M_dataplus._M_p,
               local_180._name._M_dataplus._M_p + local_180._name._M_string_length);
    local_1d0._M_p = (pointer)&local_1c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,local_180._relOp._M_dataplus._M_p,
               local_180._relOp._M_dataplus._M_p + local_180._relOp._M_string_length);
    local_1b0 = local_180._eof;
    bStack_1af = local_180._eol;
    bStack_1ae = local_180._ind;
    bStack_1ad = local_180._ded;
    bStack_1ac = local_180._isWholeNumber;
    bStack_1ab = local_180._isString;
    cStack_1aa = local_180._symbol;
    uStack_1a9 = local_180._71_1_;
    uStack_1a8 = local_180._wholeNumber._0_4_;
    uStack_1a4 = local_180._wholeNumber._4_4_;
    local_1a0._M_p = (pointer)&local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a0,local_180._string._M_dataplus._M_p,
               local_180._string._M_dataplus._M_p + local_180._string._M_string_length);
    InfixExprNode::InfixExprNode(this_00,(Token *)local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_p != &local_190) {
      operator_delete(local_1a0._M_p,local_190._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p != &local_1c0) {
      operator_delete(local_1d0._M_p,local_1c0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1f0._0_8_ != local_1f0 + 0x10) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    ppEVar3 = InfixExprNode::left(this_00);
    *ppEVar3 = &pIVar2->super_ExprNode;
    pEVar4 = arithExpr(this);
    ppEVar3 = InfixExprNode::right(this_00);
    *ppEVar3 = pEVar4;
    Tokenizer::getToken((Token *)local_110,this->tokenizer);
    std::__cxx11::string::operator=((string *)local_a0,(string *)local_110);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_f0);
    local_60 = local_d0;
    bStack_5f = bStack_cf;
    bStack_5e = bStack_ce;
    bStack_5d = bStack_cd;
    bStack_5c = bStack_cc;
    bStack_5b = bStack_cb;
    cStack_5a = cStack_ca;
    uStack_59 = uStack_c9;
    dStack_58 = dStack_c8;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_p != &local_b0) {
      operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._string._M_dataplus._M_p != &local_180._string.field_2) {
      operator_delete(local_180._string._M_dataplus._M_p,
                      local_180._string.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._relOp._M_dataplus._M_p != &local_180._relOp.field_2) {
      operator_delete(local_180._relOp._M_dataplus._M_p,
                      local_180._relOp.field_2._M_allocated_capacity + 1);
    }
    pIVar2 = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._name._M_dataplus._M_p != &local_180._name.field_2) {
      operator_delete(local_180._name._M_dataplus._M_p,
                      local_180._name.field_2._M_allocated_capacity + 1);
    }
  }
  Tokenizer::ungetToken(this->tokenizer);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  return &pIVar2->super_ExprNode;
}

Assistant:

ExprNode *Parser::compareExpr() {

    // comparison: arith_expr {comp_op arith_expr}*

    ExprNode *left = arithExpr();
    Token tok = tokenizer.getToken();
    while (tok.isComparisonOperator()) {
        tokenizer.ungetToken();
        Token op = compareOp();
        auto *p = new InfixExprNode(op);
        p->left() = left;
        p->right() = arithExpr();
        left = p;
        tok = tokenizer.getToken();
    }
    tokenizer.ungetToken();
    return left;
}